

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

string<char> * __thiscall irr::core::string<char>::operator=(string<char> *this,string<char> *other)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  if (this != other) {
    if (this->array != (char *)0x0) {
      operator_delete__(this->array);
    }
    iVar1 = other->used;
    this->used = iVar1;
    this->allocated = iVar1;
    pcVar2 = (char *)operator_new__((long)iVar1);
    this->array = pcVar2;
    if (0 < (long)iVar1) {
      pcVar2 = other->array;
      lVar3 = 0;
      do {
        this->array[lVar3] = pcVar2[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->used);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const string<T>& other) 
	{
		if (this == &other)
			return *this;

		delete [] array;
		allocated = used = other.size()+1;
		array = new T[used];

		const T* p = other.c_str();
		for (s32 i=0; i<used; ++i, ++p)
			array[i] = *p;

		return *this;
	}